

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O1

bool __thiscall
Am_Inter_Location_Data::operator==(Am_Inter_Location_Data *this,Am_Inter_Location_Data *test_data)

{
  bool bVar1;
  
  bVar1 = Am_Object::operator==(&this->ref_obj,&test_data->ref_obj);
  if ((((bVar1) && (this->as_line == test_data->as_line)) && (this->growing == test_data->growing))
     && ((((this->data).rect.left == (test_data->data).rect.left &&
          ((this->data).rect.top == (test_data->data).rect.top)) &&
         ((this->data).rect.width == (test_data->data).rect.width)))) {
    bVar1 = (this->data).rect.height == (test_data->data).rect.height;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool operator==(const Am_Inter_Location_Data &test_data) const
  {
    return ((ref_obj == test_data.ref_obj) && (as_line == test_data.as_line) &&
            (growing == test_data.growing) &&
            (data.line.x1 == test_data.data.line.x1) &&
            (data.line.y1 == test_data.data.line.y1) &&
            (data.line.x2 == test_data.data.line.x2) &&
            (data.line.y2 == test_data.data.line.y2));
  }